

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb_test.cc
# Opt level: O0

void anon_unknown.dwarf_1103bec::Dropout
               (TX_SIZE tx_size,TX_TYPE tx_type,int dropout_num_before,int dropout_num_after,
               tran_low_t *qcoeff_scan)

{
  undefined1 uVar1;
  bool bVar2;
  TX_SIZE in_DIL;
  long in_R8;
  AssertionResult gtest_ar_1;
  int i_1;
  AssertionResult gtest_ar;
  uint16_t new_eob;
  uint8_t txb_entropy_ctx [1];
  uint16_t eobs [1];
  int kBlock;
  int kPlane;
  MACROBLOCK mb;
  uint16_t eob;
  int i;
  tran_low_t dqcoeff [4096];
  int kDequantFactor;
  int max_eob;
  tran_low_t qcoeff [4096];
  AssertHelper *in_stack_fffffffffffd2870;
  unsigned_short *in_stack_fffffffffffd2878;
  tran_low_t *in_stack_fffffffffffd2880;
  AssertionResult *this;
  undefined4 in_stack_fffffffffffd2888;
  int in_stack_fffffffffffd288c;
  char *in_stack_fffffffffffd2890;
  AssertionResult *this_00;
  undefined5 in_stack_fffffffffffd28a0;
  undefined1 uVar3;
  undefined1 uVar4;
  int in_stack_fffffffffffd28b0;
  TX_TYPE in_stack_fffffffffffd28b6;
  TX_SIZE in_stack_fffffffffffd28b7;
  int in_stack_fffffffffffd28b8;
  int in_stack_fffffffffffd28bc;
  MACROBLOCK *in_stack_fffffffffffd28c0;
  int in_stack_fffffffffffd28d0;
  int iStack_2d72c;
  Message *in_stack_fffffffffffd28e8;
  AssertHelper *in_stack_fffffffffffd28f0;
  AssertionResult AStack_2d708;
  ushort uStack_2d6f6;
  undefined1 uStack_2d6f3;
  ushort auStack_2d6f2 [5];
  undefined1 auStack_2d6e8 [8];
  int *piStack_2d6e0;
  int *piStack_2d6d8;
  ushort *puStack_2d6c8;
  undefined1 *puStack_2d6c0;
  ushort local_802e;
  int local_802c;
  int local_8028 [4098];
  undefined4 local_4020;
  int local_401c;
  int local_4018 [4096];
  long local_18;
  TX_SIZE local_1;
  
  local_18 = in_R8;
  local_1 = in_DIL;
  ToLexicoOrder((TX_SIZE)((ulong)in_stack_fffffffffffd2890 >> 0x38),
                (TX_TYPE)((ulong)in_stack_fffffffffffd2890 >> 0x30),
                (tran_low_t *)CONCAT44(in_stack_fffffffffffd288c,in_stack_fffffffffffd2888),
                in_stack_fffffffffffd2880);
  local_401c = av1_get_max_eob(local_1);
  local_4020 = 10;
  for (local_802c = 0; local_802c < local_401c; local_802c = local_802c + 1) {
    local_8028[local_802c] = local_4018[local_802c] * 10;
  }
  local_802e = (ushort)local_401c;
  while( true ) {
    uVar4 = false;
    if (local_802e != 0) {
      uVar4 = *(int *)(local_18 + (long)(int)(local_802e - 1) * 4) == 0;
    }
    if ((bool)uVar4 == false) break;
    local_802e = local_802e - 1;
  }
  auStack_2d6f2[3] = 0;
  auStack_2d6f2[4] = 0;
  auStack_2d6f2[1] = 0;
  auStack_2d6f2[2] = 0;
  memset(auStack_2d6e8,0,0x256b0);
  auStack_2d6f2[0] = local_802e;
  puStack_2d6c8 = auStack_2d6f2;
  piStack_2d6d8 = local_4018;
  piStack_2d6e0 = local_8028;
  puStack_2d6c0 = &uStack_2d6f3;
  av1_dropout_qcoeff_num
            (in_stack_fffffffffffd28c0,in_stack_fffffffffffd28bc,in_stack_fffffffffffd28b8,
             in_stack_fffffffffffd28b7,in_stack_fffffffffffd28b6,in_stack_fffffffffffd28b0,
             in_stack_fffffffffffd28d0);
  ToScanOrder((TX_SIZE)((ulong)in_stack_fffffffffffd2890 >> 0x38),
              (TX_TYPE)((ulong)in_stack_fffffffffffd2890 >> 0x30),
              (tran_low_t *)CONCAT44(in_stack_fffffffffffd288c,in_stack_fffffffffffd2888),
              in_stack_fffffffffffd2880);
  uStack_2d6f6 = (ushort)local_401c;
  while( true ) {
    uVar3 = false;
    if (uStack_2d6f6 != 0) {
      uVar3 = *(int *)(local_18 + (long)(int)(uStack_2d6f6 - 1) * 4) == 0;
    }
    if ((bool)uVar3 == false) break;
    uStack_2d6f6 = uStack_2d6f6 - 1;
  }
  this_00 = &AStack_2d708;
  testing::internal::EqHelper::Compare<unsigned_short,_unsigned_short,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffd288c,in_stack_fffffffffffd2888),
             (char *)in_stack_fffffffffffd2880,in_stack_fffffffffffd2878,
             (unsigned_short *)in_stack_fffffffffffd2870);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!(bool)uVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(uVar4,CONCAT16(uVar3,CONCAT15(uVar1,in_stack_fffffffffffd28a0))))
    ;
    in_stack_fffffffffffd2890 =
         testing::AssertionResult::failure_message((AssertionResult *)0xae5fde);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar4,CONCAT16(uVar3,CONCAT15(uVar1,in_stack_fffffffffffd28a0))),
               (Type)((ulong)this_00 >> 0x20),in_stack_fffffffffffd2890,in_stack_fffffffffffd288c,
               (char *)in_stack_fffffffffffd2880);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffd28f0,in_stack_fffffffffffd28e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffd2870);
    testing::Message::~Message((Message *)0xae602c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xae607e);
  for (iStack_2d72c = 0; iStack_2d72c < local_401c; iStack_2d72c = iStack_2d72c + 1) {
    this = (AssertionResult *)&stack0xfffffffffffd28c0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffd288c,in_stack_fffffffffffd2888),(char *)this,
               (int *)in_stack_fffffffffffd2878,(int *)in_stack_fffffffffffd2870);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(this);
    in_stack_fffffffffffd288c = CONCAT13(bVar2,(int3)in_stack_fffffffffffd288c);
    if (!bVar2) {
      testing::Message::Message
                ((Message *)
                 CONCAT17(uVar4,CONCAT16(uVar3,CONCAT15(uVar1,in_stack_fffffffffffd28a0))));
      in_stack_fffffffffffd2878 =
           (unsigned_short *)testing::AssertionResult::failure_message((AssertionResult *)0xae613d);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 CONCAT17(uVar4,CONCAT16(uVar3,CONCAT15(uVar1,in_stack_fffffffffffd28a0))),
                 (Type)((ulong)this_00 >> 0x20),in_stack_fffffffffffd2890,in_stack_fffffffffffd288c,
                 &this->success_);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffd28f0,in_stack_fffffffffffd28e8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffd2870);
      testing::Message::~Message((Message *)0xae618b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xae61d7);
  }
  return;
}

Assistant:

void Dropout(TX_SIZE tx_size, TX_TYPE tx_type, int dropout_num_before,
             int dropout_num_after, tran_low_t *qcoeff_scan) {
  tran_low_t qcoeff[MAX_TX_SQUARE];
  // qcoeff_scan is assumed to be in scan order, since tests are easier to
  // understand this way, but av1_dropout_qcoeff expects coeffs in lexico order
  // so we convert to lexico then back to scan afterwards.
  ToLexicoOrder(tx_size, tx_type, qcoeff_scan, qcoeff);

  const int max_eob = av1_get_max_eob(tx_size);
  const int kDequantFactor = 10;
  tran_low_t dqcoeff[MAX_TX_SQUARE];
  for (int i = 0; i < max_eob; ++i) {
    dqcoeff[i] = qcoeff[i] * kDequantFactor;
  }

  uint16_t eob = max_eob;
  while (eob > 0 && qcoeff_scan[eob - 1] == 0) --eob;

  MACROBLOCK mb;
  const int kPlane = 0;
  const int kBlock = 0;
  memset(&mb, 0, sizeof(mb));
  uint16_t eobs[] = { eob };
  mb.plane[kPlane].eobs = eobs;
  mb.plane[kPlane].qcoeff = qcoeff;
  mb.plane[kPlane].dqcoeff = dqcoeff;
  uint8_t txb_entropy_ctx[1];
  mb.plane[kPlane].txb_entropy_ctx = txb_entropy_ctx;

  av1_dropout_qcoeff_num(&mb, kPlane, kBlock, tx_size, tx_type,
                         dropout_num_before, dropout_num_after);

  ToScanOrder(tx_size, tx_type, qcoeff, qcoeff_scan);

  // Check updated eob value is valid.
  uint16_t new_eob = max_eob;
  while (new_eob > 0 && qcoeff_scan[new_eob - 1] == 0) --new_eob;
  EXPECT_EQ(new_eob, mb.plane[kPlane].eobs[0]);

  // Check dqcoeff is still valid.
  for (int i = 0; i < max_eob; ++i) {
    EXPECT_EQ(qcoeff[i] * kDequantFactor, dqcoeff[i]);
  }
}